

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

CharIterator * __thiscall
absl::Cord::FindImpl
          (CharIterator *__return_storage_ptr__,Cord *this,CharIterator it,string_view needle)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  CharIterator *pCVar5;
  ulong uVar6;
  size_type __n;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  bool bVar12;
  char *local_100;
  char *local_d8;
  ChunkIterator local_c8;
  
  uVar6 = needle._M_len;
  if (uVar6 == 0) {
    __assert_fail("!needle.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/cord.cc"
                  ,0x4d1,
                  "absl::Cord::CharIterator absl::Cord::FindImpl(CharIterator, absl::string_view) const"
                 );
  }
  uVar11 = it.chunk_iterator_.current_chunk_._M_len;
  pcVar8 = it.chunk_iterator_.current_chunk_._M_str;
  uVar7 = it.chunk_iterator_.bytes_remaining_;
  if (it.chunk_iterator_.bytes_remaining_ < uVar6) {
    __assert_fail("it.chunk_iterator_.bytes_remaining_ >= needle.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/cord.cc"
                  ,0x4d3,
                  "absl::Cord::CharIterator absl::Cord::FindImpl(CharIterator, absl::string_view) const"
                 );
  }
  do {
    it.chunk_iterator_.current_chunk_._M_len = uVar11;
    it.chunk_iterator_.current_chunk_._M_str = pcVar8;
    it.chunk_iterator_.bytes_remaining_ = uVar7;
    if (uVar7 < uVar6) {
      memset(__return_storage_ptr__,0,0x98);
      (__return_storage_ptr__->chunk_iterator_).btree_reader_.navigator_.height_ = -1;
      return __return_storage_ptr__;
    }
    if (uVar7 == 0) {
LAB_0013372b:
      FindImpl();
LAB_00133730:
      FindImpl();
LAB_00133735:
      __assert_fail("!haystack_chunk.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/cord.cc"
                    ,0x4ad,
                    "bool absl::(anonymous namespace)::IsSubstringInCordAt(absl::Cord::CharIterator, absl::string_view)"
                   );
    }
    if (uVar11 == 0) {
      __assert_fail("!haystack_chunk.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/cord.cc"
                    ,0x4dc,
                    "absl::Cord::CharIterator absl::Cord::FindImpl(CharIterator, absl::string_view) const"
                   );
    }
    pcVar4 = (char *)memchr(pcVar8,(int)*needle._M_str,uVar11);
    uVar9 = (long)pcVar4 - (long)pcVar8;
    if (uVar9 == 0xffffffffffffffff || pcVar4 == (char *)0x0) {
      if (uVar11 <= uVar7) {
        if ((-1 < (long)it.chunk_iterator_.btree_reader_.navigator_.height_) &&
           (it.chunk_iterator_.btree_reader_.navigator_.node_
            [it.chunk_iterator_.btree_reader_.navigator_.height_] != (CordRepBtree *)0x0)) {
          ChunkIterator::AdvanceBytesBtree(&it.chunk_iterator_,uVar11);
          pCVar5 = (CharIterator *)(*(code *)&LAB_00133699)();
          return pCVar5;
        }
        it.chunk_iterator_.bytes_remaining_ = 0;
        pCVar5 = (CharIterator *)(*(code *)&LAB_00133699)();
        return pCVar5;
      }
LAB_00133754:
      __assert_fail("bytes_remaining_ >= n",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/cord.h"
                    ,0x626,"void absl::Cord::ChunkIterator::AdvanceBytes(size_t)");
    }
    if (uVar7 < uVar9) goto LAB_00133754;
    if (uVar11 < uVar9 || uVar11 - uVar9 == 0) {
      if (pcVar4 != pcVar8) {
        if (((long)it.chunk_iterator_.btree_reader_.navigator_.height_ < 0) ||
           (it.chunk_iterator_.btree_reader_.navigator_.node_
            [it.chunk_iterator_.btree_reader_.navigator_.height_] == (CordRepBtree *)0x0)) {
          it.chunk_iterator_.bytes_remaining_ = 0;
        }
        else {
          ChunkIterator::AdvanceBytesBtree(&it.chunk_iterator_,uVar9);
        }
      }
    }
    else {
      it.chunk_iterator_.current_chunk_._M_str = pcVar8 + uVar9;
      it.chunk_iterator_.current_chunk_._M_len = uVar11 - uVar9;
      it.chunk_iterator_.bytes_remaining_ = uVar7 - uVar9;
    }
    uVar2 = 3;
    if (it.chunk_iterator_.bytes_remaining_ < uVar6) {
LAB_001334b8:
      pCVar5 = (CharIterator *)
               (*(code *)((long)&DAT_0016e874 + (long)(int)(&DAT_0016e874)[uVar2]))();
      return pCVar5;
    }
    memcpy(&local_c8,&it.chunk_iterator_,0x98);
    if (local_c8.bytes_remaining_ == 0) goto LAB_00133730;
    local_d8 = local_c8.current_chunk_._M_str;
    local_100 = local_c8.current_chunk_._M_str;
    pcVar8 = needle._M_str;
    sVar10 = local_c8.current_chunk_._M_len;
    uVar11 = uVar6;
    do {
      if (sVar10 == 0) goto LAB_00133735;
      uVar7 = sVar10;
      if (uVar11 < sVar10) {
        uVar7 = uVar11;
      }
      if (uVar11 == 0) {
        bVar12 = true;
      }
      else {
        iVar3 = bcmp(pcVar8,local_d8,uVar7);
        bVar12 = iVar3 == 0;
      }
      bVar1 = false;
      uVar9 = uVar7;
      if (!bVar12) {
        uVar9 = 0;
      }
      if (bVar12) {
        if (uVar11 - uVar9 == 0) {
          local_100 = (char *)0x1;
          bVar1 = false;
        }
        else {
          if (local_c8.bytes_remaining_ < uVar7) goto LAB_00133754;
          if (local_c8.current_chunk_._M_len < uVar7 || local_c8.current_chunk_._M_len - uVar7 == 0)
          {
            if (uVar11 != 0) {
              if (((long)local_c8.btree_reader_.navigator_.height_ < 0) ||
                 (local_c8.btree_reader_.navigator_.node_[local_c8.btree_reader_.navigator_.height_]
                  == (CordRepBtree *)0x0)) {
                local_c8.bytes_remaining_ = 0;
              }
              else {
                ChunkIterator::AdvanceBytesBtree(&local_c8,uVar7);
              }
            }
          }
          else {
            local_c8.current_chunk_._M_str = local_c8.current_chunk_._M_str + uVar7;
            local_c8.current_chunk_._M_len = local_c8.current_chunk_._M_len - uVar7;
            local_c8.bytes_remaining_ = local_c8.bytes_remaining_ - uVar7;
          }
          if (local_c8.bytes_remaining_ == 0) {
            FindImpl();
            goto LAB_0013372b;
          }
          local_d8 = local_c8.current_chunk_._M_str;
          bVar1 = true;
          sVar10 = local_c8.current_chunk_._M_len;
        }
      }
      else {
        local_100 = (char *)0x0;
      }
      pcVar8 = pcVar8 + uVar9;
      uVar11 = uVar11 - uVar9;
    } while (bVar1);
    if (((ulong)local_100 & 1) != 0) {
      memcpy(__return_storage_ptr__,&it,0x98);
      return __return_storage_ptr__;
    }
    if (it.chunk_iterator_.bytes_remaining_ == 0) goto LAB_00133754;
    if (it.chunk_iterator_.current_chunk_._M_len < 2) {
      if (((long)it.chunk_iterator_.btree_reader_.navigator_.height_ < 0) ||
         (it.chunk_iterator_.btree_reader_.navigator_.node_
          [it.chunk_iterator_.btree_reader_.navigator_.height_] == (CordRepBtree *)0x0)) {
        it.chunk_iterator_.bytes_remaining_ = 0;
        uVar2 = 0;
        goto LAB_001334b8;
      }
      ChunkIterator::AdvanceBytesBtree(&it.chunk_iterator_,1);
      uVar11 = it.chunk_iterator_.current_chunk_._M_len;
      pcVar8 = it.chunk_iterator_.current_chunk_._M_str;
      uVar7 = it.chunk_iterator_.bytes_remaining_;
    }
    else {
      uVar11 = it.chunk_iterator_.current_chunk_._M_len - 1;
      pcVar8 = it.chunk_iterator_.current_chunk_._M_str + 1;
      uVar7 = it.chunk_iterator_.bytes_remaining_ - 1;
    }
  } while( true );
}

Assistant:

absl::Cord::CharIterator absl::Cord::FindImpl(CharIterator it,
                                              absl::string_view needle) const {
  // Ensure preconditions are met by callers first.

  // Needle must not be empty.
  assert(!needle.empty());
  // Haystack must be at least as large as needle.
  assert(it.chunk_iterator_.bytes_remaining_ >= needle.size());

  // Cord is a sequence of chunks. To find `needle` we go chunk by chunk looking
  // for the first char of needle, up until we have advanced `N` defined as
  // `haystack.size() - needle.size()`. If we find the first char of needle at
  // `P` and `P` is less than `N`, we then call `IsSubstringInCordAt` to
  // see if this is the needle. If not, we advance to `P + 1` and try again.
  while (it.chunk_iterator_.bytes_remaining_ >= needle.size()) {
    auto haystack_chunk = Cord::ChunkRemaining(it);
    assert(!haystack_chunk.empty());
    // Look for the first char of `needle` in the current chunk.
    auto idx = haystack_chunk.find(needle.front());
    if (idx == absl::string_view::npos) {
      // No potential match in this chunk, advance past it.
      Cord::Advance(&it, haystack_chunk.size());
      continue;
    }
    // We found the start of a potential match in the chunk. Advance the
    // iterator and haystack chunk to the match the position.
    Cord::Advance(&it, idx);
    // Check if there is enough haystack remaining to actually have a match.
    if (it.chunk_iterator_.bytes_remaining_ < needle.size()) {
      break;
    }
    // Check if this is `needle`.
    if (IsSubstringInCordAt(it, needle)) {
      return it;
    }
    // No match, increment the iterator for the next attempt.
    Cord::Advance(&it, 1);
  }
  // If we got here, we did not find `needle`.
  return char_end();
}